

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimalControlProblem.cpp
# Opt level: O0

bool __thiscall
iDynTree::optimalcontrol::OptimalControlProblem::setControlBoxConstraints
          (OptimalControlProblem *this,
          shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::VectorDynSize>_>
          *minControl,
          shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::VectorDynSize>_>
          *maxControl)

{
  bool bVar1;
  shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::VectorDynSize>_>
  *in_stack_ffffffffffffff78;
  shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::VectorDynSize>_>
  *in_stack_ffffffffffffff80;
  shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::VectorDynSize>_> *this_00;
  undefined6 in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff8e;
  undefined1 in_stack_ffffffffffffff8f;
  shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::VectorDynSize>_> local_50 [4];
  byte local_1;
  
  std::shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::VectorDynSize>_>::shared_ptr
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  bVar1 = setControlLowerBound
                    ((OptimalControlProblem *)
                     CONCAT17(in_stack_ffffffffffffff8f,
                              CONCAT16(in_stack_ffffffffffffff8e,in_stack_ffffffffffffff88)),
                     in_stack_ffffffffffffff80);
  local_1 = 0;
  if (bVar1) {
    this_00 = local_50;
    std::shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::VectorDynSize>_>::
    shared_ptr(this_00,in_stack_ffffffffffffff78);
    local_1 = setControlUpperBound
                        ((OptimalControlProblem *)
                         CONCAT17(local_1,CONCAT16(in_stack_ffffffffffffff8e,
                                                   in_stack_ffffffffffffff88)),this_00);
    std::shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::VectorDynSize>_>::
    ~shared_ptr((shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::VectorDynSize>_> *
                )0x2fd127);
  }
  std::shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::VectorDynSize>_>::
  ~shared_ptr((shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::VectorDynSize>_> *)
              0x2fd131);
  return (bool)(local_1 & 1);
}

Assistant:

bool OptimalControlProblem::setControlBoxConstraints(std::shared_ptr<TimeVaryingVector> minControl, std::shared_ptr<TimeVaryingVector> maxControl)
        {
            return setControlLowerBound(minControl) && setControlUpperBound(maxControl);
        }